

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::initialiseDevexFramework(HEkkPrimal *this)

{
  HEkk *pHVar1;
  pointer piVar2;
  HighsInt iCol;
  long lVar3;
  int iVar4;
  value_type_conflict2 local_14;
  value_type_conflict1 local_10;
  
  local_10 = 1.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->edge_weight_,(long)this->num_tot,&local_10);
  local_14 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->devex_index_,(long)this->num_tot,&local_14);
  pHVar1 = this->ekk_instance_;
  piVar2 = (this->devex_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 < this->num_tot; lVar3 = lVar3 + 1) {
    iVar4 = (int)(pHVar1->basis_).nonbasicFlag_.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
    piVar2[lVar3] = iVar4 * iVar4;
  }
  this->num_devex_iterations_ = 0;
  this->num_bad_devex_weight_ = 0;
  if (this->report_hyper_chuzc != false) {
    puts("initialiseDevexFramework");
  }
  this->initialise_hyper_chuzc = this->use_hyper_chuzc;
  this->max_hyper_chuzc_non_candidate_measure = -1.0;
  this->done_next_chuzc = false;
  return;
}

Assistant:

void HEkkPrimal::initialiseDevexFramework() {
  edge_weight_.assign(num_tot, 1.0);
  devex_index_.assign(num_tot, 0);
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    const HighsInt nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_[iCol];
    devex_index_[iCol] = nonbasicFlag * nonbasicFlag;
  }
  num_devex_iterations_ = 0;
  num_bad_devex_weight_ = 0;
  if (report_hyper_chuzc) printf("initialiseDevexFramework\n");
  hyperChooseColumnClear();
}